

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextWindow(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  uint in_ESI;
  int mouse_button;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiPopupFlags in_stack_00000040;
  ImGuiID in_stack_00000044;
  ImGuiMouseButton button;
  ImGuiHoveredFlags in_stack_fffffffffffffff0;
  
  button = (ImGuiMouseButton)((ulong)GImGui->CurrentWindow >> 0x20);
  ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(g._4_4_,(ImGuiID)g),
                     (char *)CONCAT44(window._4_4_,window._0_4_),_mouse_button);
  bVar1 = IsMouseReleased(button);
  if (((bVar1) && (bVar1 = IsWindowHovered(in_stack_fffffffffffffff0), bVar1)) &&
     (((in_ESI & 0x100) == 0 || (bVar1 = IsAnyItemHovered(), !bVar1)))) {
    OpenPopupEx(in_stack_00000044,in_stack_00000040);
  }
  bVar1 = BeginPopupEx((ImGuiID)g,window._4_4_);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextWindow(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!str_id)
        str_id = "window_context";
    ImGuiID id = window->GetID(str_id);
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsWindowHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        if (!(popup_flags & ImGuiPopupFlags_NoOpenOverItems) || !IsAnyItemHovered())
            OpenPopupEx(id, popup_flags);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings);
}